

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

void WebPIDelete(WebPIDecoder *idec)

{
  VP8Decoder *dec;
  
  if (idec != (WebPIDecoder *)0x0) {
    dec = (VP8Decoder *)idec->dec;
    if (dec != (VP8Decoder *)0x0) {
      if (idec->is_lossless == 0) {
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical(dec,&idec->io);
        }
        VP8Delete((VP8Decoder *)idec->dec);
      }
      else {
        VP8LDelete((VP8LDecoder *)dec);
      }
    }
    if ((idec->mem).mode == MEM_MODE_APPEND) {
      WebPSafeFree((idec->mem).buf);
      WebPSafeFree((idec->mem).part0_buf);
    }
    WebPFreeDecBuffer(&idec->output);
    WebPSafeFree(idec);
    return;
  }
  return;
}

Assistant:

void WebPIDelete(WebPIDecoder* idec) {
  if (idec == NULL) return;
  if (idec->dec != NULL) {
    if (!idec->is_lossless) {
      if (idec->state == STATE_VP8_DATA) {
        // Synchronize the thread, clean-up and check for errors.
        // TODO(vrabaud) do we care about the return result?
        (void)VP8ExitCritical((VP8Decoder*)idec->dec, &idec->io);
      }
      VP8Delete((VP8Decoder*)idec->dec);
    } else {
      VP8LDelete((VP8LDecoder*)idec->dec);
    }
  }
  ClearMemBuffer(&idec->mem);
  WebPFreeDecBuffer(&idec->output);
  WebPSafeFree(idec);
}